

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readArray(OurReader *this,Token *tokenStart)

{
  iterator *piVar1;
  bool bVar2;
  byte *pbVar3;
  _Elt_pointer ppVVar4;
  int index;
  byte bVar5;
  Token endArray;
  Token token;
  Value init;
  undefined1 local_90 [32];
  Token local_70;
  Value local_58;
  
  Value::Value(&local_58,arrayValue);
  ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar4 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar4[-1],&local_58);
  ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar4 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar4[-1],(long)tokenStart->start_ - (long)this->begin_);
  pbVar3 = (byte *)this->current_;
  while (pbVar3 != (byte *)this->end_) {
    bVar5 = *pbVar3;
    if ((0x20 < (ulong)bVar5) || ((0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) == 0))
    goto LAB_0011ce1d;
    pbVar3 = pbVar3 + 1;
    this->current_ = (Location)pbVar3;
  }
  bVar5 = *pbVar3;
LAB_0011ce1d:
  if (bVar5 == 0x5d) {
    readToken(this,(Token *)local_90);
LAB_0011ce30:
    bVar2 = true;
  }
  else {
    index = 0;
    do {
      ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar4 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_90._0_8_ = Value::operator[](ppVVar4[-1],index);
      ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar4 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                  ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_90);
      }
      else {
        *ppVVar4 = (Value *)local_90._0_8_;
        piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      bVar2 = readValue(this);
      std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
      if (!bVar2) {
        recoverFromError(this,tokenArrayEnd);
        goto LAB_0011cf36;
      }
      readToken(this,&local_70);
      index = index + 1;
      while (local_70.type_ == tokenComment) {
        readToken(this,&local_70);
      }
      if (local_70.type_ == tokenArrayEnd) goto LAB_0011ce30;
    } while (local_70.type_ == tokenArraySeparator);
    local_90._0_8_ = (Value *)(local_90 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Missing \',\' or \']\' in array declaration","");
    addError(this,(string *)local_90,&local_70,(Location)0x0);
    recoverFromError(this,tokenArrayEnd);
    if ((Value *)local_90._0_8_ != (Value *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_);
    }
LAB_0011cf36:
    bVar2 = false;
  }
  Value::~Value(&local_58);
  return bVar2;
}

Assistant:

bool OurReader::readArray(Token& tokenStart) {
  Value init(arrayValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (*current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}